

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O3

AssertionResult * __thiscall
iutest::internal::
CmpHelperOpFailure<std::__cxx11::string,iutest::detail::iu_basic_string_view<char,std::char_traits<char>>>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expr1,char *expr2,char *op,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val1,
          iu_basic_string_view<char,_std::char_traits<char>_> *val2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  AssertionResult *pAVar3;
  char *local_230;
  char *local_228;
  internal *local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  AssertionResult local_1d8;
  undefined1 local_1b0 [128];
  ios_base local_130 [264];
  
  paVar1 = &local_1d8.m_message.field_2;
  local_1d8.m_message._M_string_length = 0;
  local_1d8.m_message.field_2._M_local_buf[0] = '\0';
  local_1d8.m_result = false;
  local_230 = expr2;
  local_228 = expr1;
  local_220 = this;
  local_1d8.m_message._M_dataplus._M_p = (pointer)paVar1;
  pAVar3 = AssertionResult::operator<<(&local_1d8,(char (*) [18])"error: Expected: ");
  pAVar3 = AssertionResult::operator<<(pAVar3,(char **)&local_220);
  pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [2])0x12b390);
  pAVar3 = AssertionResult::operator<<(pAVar3,&local_230);
  pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [2])0x12b390);
  pAVar3 = AssertionResult::operator<<(pAVar3,&local_228);
  pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [12])"\n  Actual: ");
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1b0);
  detail::
  iuUniversalPrinter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Print((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)op,
          (iu_ostream *)(local_1b0 + 0x10));
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
  std::ios_base::~ios_base(local_130);
  pAVar3 = AssertionResult::operator<<(pAVar3,&local_1f8);
  pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [5])" vs ");
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1b0);
  detail::PrintTo<char,std::char_traits<char>>
            ((iu_basic_string_view<char,_std::char_traits<char>_> *)val1,
             (iu_ostream *)(local_1b0 + 0x10));
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
  std::ios_base::~ios_base(local_130);
  pAVar3 = AssertionResult::operator<<(pAVar3,&local_218);
  (__return_storage_ptr__->m_message)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_message).field_2;
  pcVar2 = (pAVar3->m_message)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pAVar3->m_message)._M_string_length);
  __return_storage_ptr__->m_result = pAVar3->m_result;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8.m_message._M_dataplus._M_p,
                    CONCAT71(local_1d8.m_message.field_2._M_allocated_capacity._1_7_,
                             local_1d8.m_message.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult CmpHelperOpFailure(const char* expr1, const char* expr2, const char* op
    , const T1& val1, const T2& val2)
{
    return AssertionFailure() << "error: Expected: " << expr1 << " " << op << " " << expr2
        << "\n  Actual: " << FormatForComparisonFailureMessage(val1, val2)
        << " vs " << FormatForComparisonFailureMessage(val2, val1);
}